

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(void)

{
  uint local_14;
  uint local_10;
  int num2;
  int num1;
  
  num2 = 0;
  printf("Enter a dividend: ");
  __isoc99_scanf("%i",&local_10);
  printf("Enter a divisor: ");
  __isoc99_scanf("%i",&local_14);
  if ((int)local_10 % (int)local_14 == 0) {
    printf("%i is evenly divisible by %i\n",(ulong)local_10,(ulong)local_14);
  }
  else {
    printf("%i is NOT evenly divisible by %i\n",(ulong)local_10,(ulong)local_14);
  }
  return 0;
}

Assistant:

int main() {

    int num1, num2;

    printf("Enter a dividend: ");
    scanf("%i", &num1);

    printf("Enter a divisor: ");
    scanf("%i", &num2);

    if (num1 % num2 == 0) {
        printf("%i is evenly divisible by %i\n", num1, num2);
    } else {
        printf("%i is NOT evenly divisible by %i\n", num1, num2);
    }

    return 0;
}